

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void clunk::InitPawnMoves<false>(int from)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x1d9,"void clunk::InitPawnMoves(const int) [color = false]");
  }
  bVar3 = (from + 0xfU & 0x88) == 0;
  uVar1 = (ulong)(from + 0x10);
  if (!bVar3) {
    uVar1 = 0;
  }
  uVar2 = 0;
  if ((from + 0x11U & 0x88) == 0) {
    uVar2 = (ulong)(uint)from + 0x12 << (bVar3 << 3);
  }
  bVar3 = VerifyMoveMap(from,uVar2 | uVar1);
  if (bVar3) {
    *(ulong *)(_pawnCaps + (ulong)(uint)from * 8) = uVar2 | uVar1;
    return;
  }
  __assert_fail("VerifyMoveMap(from, mvs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x1e8,"void clunk::InitPawnMoves(const int) [color = false]");
}

Assistant:

void InitPawnMoves(const int from) {
  assert(IS_SQUARE(from));
  uint64_t mvs = 0ULL;
  int shift = 0;
  int to = (from + (color ? SouthWest : NorthWest));
  if (IS_SQUARE(to)) {
    assert(shift <= 56);
    mvs |= (uint64_t(to + 1) << shift);
    shift += 8;
  }
  to = (from + (color ? SouthEast : NorthEast));
  if (IS_SQUARE(to)) {
    assert(shift <= 56);
    mvs |= (uint64_t(to + 1) << shift);
    shift += 8;
  }
  assert(VerifyMoveMap(from, mvs));
  _pawnCaps[from + (color * 8)] = mvs;
}